

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.c++
# Opt level: O2

Equality __thiscall capnp::AnyPointer::Reader::equals(Reader *this,Reader right)

{
  Reader right_00;
  Reader right_01;
  PointerType PVar1;
  PointerType PVar2;
  Equality EVar3;
  ReaderFor<capnp::AnyList> local_b0;
  ReaderFor<capnp::AnyList> local_80;
  ReaderFor<capnp::AnyStruct> local_50;
  
  PVar1 = _::PointerReader::getPointerType(&this->reader);
  PVar2 = _::PointerReader::getPointerType(&right.reader);
  EVar3 = NOT_EQUAL;
  if (PVar1 == PVar2) {
    PVar1 = _::PointerReader::getPointerType(&this->reader);
    switch(PVar1) {
    case NULL_:
      EVar3 = EQUAL;
      break;
    case STRUCT:
      getAs<capnp::AnyStruct>((ReaderFor<capnp::AnyStruct> *)&local_b0,this);
      getAs<capnp::AnyStruct>(&local_50,(Reader *)&right.reader);
      right_01._reader.capTable = local_50._reader.capTable;
      right_01._reader.segment = local_50._reader.segment;
      right_01._reader.data = local_50._reader.data;
      right_01._reader.pointers = local_50._reader.pointers;
      right_01._reader.dataSize = local_50._reader.dataSize;
      right_01._reader.pointerCount = local_50._reader.pointerCount;
      right_01._reader._38_2_ = local_50._reader._38_2_;
      right_01._reader.nestingLimit = local_50._reader.nestingLimit;
      right_01._reader._44_4_ = local_50._reader._44_4_;
      EVar3 = AnyStruct::Reader::equals((Reader *)&local_b0,right_01);
      break;
    case LIST:
      getAs<capnp::AnyList>(&local_b0,this);
      getAs<capnp::AnyList>(&local_80,(Reader *)&right.reader);
      right_00._reader.capTable = local_80._reader.capTable;
      right_00._reader.segment = local_80._reader.segment;
      right_00._reader.ptr = local_80._reader.ptr;
      right_00._reader.elementCount = local_80._reader.elementCount;
      right_00._reader.step = local_80._reader.step;
      right_00._reader.structDataSize = local_80._reader.structDataSize;
      right_00._reader.structPointerCount = local_80._reader.structPointerCount;
      right_00._reader.elementSize = local_80._reader.elementSize;
      right_00._reader._39_1_ = local_80._reader._39_1_;
      right_00._reader.nestingLimit = local_80._reader.nestingLimit;
      right_00._reader._44_4_ = local_80._reader._44_4_;
      EVar3 = AnyList::Reader::equals(&local_b0,right_00);
      break;
    case CAPABILITY:
      EVar3 = UNKNOWN_CONTAINS_CAPS;
      break;
    default:
      kj::_::unreachable();
    }
  }
  return EVar3;
}

Assistant:

Equality AnyPointer::Reader::equals(AnyPointer::Reader right) const {
  if(getPointerType() != right.getPointerType()) {
    return Equality::NOT_EQUAL;
  }
  switch(getPointerType()) {
    case PointerType::NULL_:
      return Equality::EQUAL;
    case PointerType::STRUCT:
      return getAs<AnyStruct>().equals(right.getAs<AnyStruct>());
    case PointerType::LIST:
      return getAs<AnyList>().equals(right.getAs<AnyList>());
    case PointerType::CAPABILITY:
      return Equality::UNKNOWN_CONTAINS_CAPS;
  }
  // There aren't currently any other types of pointers
  KJ_UNREACHABLE;
}